

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidUpsample(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  Arena *pAVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  ostream *poVar5;
  undefined1 local_c8 [8];
  Result res;
  UpsampleLayerParams *params;
  NeuralNetworkLayer *upsampleLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"input",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this,5);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"probs",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_00,EXACT_ARRAY_MAPPING);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_upsample(this_01)
  ;
  CoreML::Specification::UpsampleLayerParams::add_scalingfactor
            ((UpsampleLayerParams *)res.m_message.field_2._8_8_,1);
  CoreML::validate<(MLModelType)500>((Result *)local_c8,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_c8);
  if (m1._oneof_case_[0]._0_1_) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xbc5);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((res).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_c8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidUpsample() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *upsampleLayer = nn->add_layers();
    upsampleLayer->add_input("input");
    upsampleLayer->add_output("probs");
    auto *params = upsampleLayer->mutable_upsample();

    // Scaling factor needs to be 2D
    params->add_scalingfactor(1.0);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}